

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O3

oonf_layer2_data *
oonf_layer2_neigh_add_path(char *ifname,netaddr *l2neigh_addr,oonf_layer2_neighbor_index idx)

{
  oonf_layer2_net *l2net;
  oonf_layer2_neigh *poVar1;
  oonf_layer2_neigh_key local_38;
  
  l2net = oonf_layer2_net_add(ifname);
  if (l2net != (oonf_layer2_net *)0x0) {
    local_38.link_id_length = '\0';
    local_38.link_id[0] = '\0';
    local_38.link_id[1] = '\0';
    local_38.link_id[2] = '\0';
    local_38.link_id[3] = '\0';
    local_38.link_id[4] = '\0';
    local_38.link_id[5] = '\0';
    local_38.link_id[6] = '\0';
    local_38.link_id[7] = '\0';
    local_38.link_id[8] = '\0';
    local_38.link_id[9] = '\0';
    local_38.link_id[10] = '\0';
    local_38.link_id[0xb] = '\0';
    local_38.link_id[0xc] = '\0';
    local_38.link_id[0xd] = '\0';
    local_38.link_id[0xe] = '\0';
    local_38.link_id[0xf] = '\0';
    local_38.addr._addr._0_8_ = *(undefined8 *)l2neigh_addr->_addr;
    local_38.addr._addr._8_8_ = *(undefined8 *)(l2neigh_addr->_addr + 8);
    local_38.addr._type = l2neigh_addr->_type;
    local_38.addr._prefix_len = l2neigh_addr->_prefix_len;
    poVar1 = oonf_layer2_neigh_add_lid(l2net,&local_38);
    if (poVar1 != (oonf_layer2_neigh *)0x0) {
      return poVar1->data + idx;
    }
  }
  return (oonf_layer2_data *)0x0;
}

Assistant:

struct oonf_layer2_data *
oonf_layer2_neigh_add_path(const char *ifname, const struct netaddr *l2neigh_addr, enum oonf_layer2_neighbor_index idx) {
    struct oonf_layer2_net *l2net;
  struct oonf_layer2_neigh *l2neigh;

  /* query layer2 database about neighbor */
  l2net = oonf_layer2_net_add(ifname);
  if (l2net == NULL) {
    return NULL;
  }

  /* look for neighbor specific data */
  l2neigh = oonf_layer2_neigh_add(l2net, l2neigh_addr);
  if (l2neigh == NULL) {
    return NULL;
  }

  return &l2neigh->data[idx];
}